

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsBuiltinPrecisionTests.cpp
# Opt level: O1

IVal * deqp::gls::BuiltinPrecisionTests::
       ContainerTraits<tcu::Vector<float,_2>,_tcu::Vector<tcu::Interval,_2>_>::doRound
                 (IVal *__return_storage_ptr__,FloatFormat *fmt,Vector<float,_2> *value)

{
  double dVar1;
  long lVar2;
  Interval *pIVar3;
  int ndx;
  Interval local_60;
  Interval local_48;
  
  lVar2 = 0x10;
  do {
    *(undefined1 *)((long)__return_storage_ptr__->m_data + lVar2 + -0x10) = 0;
    *(undefined8 *)((long)__return_storage_ptr__->m_data + lVar2 + -8) = 0x7ff0000000000000;
    *(undefined8 *)(&__return_storage_ptr__->m_data[0].m_hasNaN + lVar2) = 0xfff0000000000000;
    lVar2 = lVar2 + 0x18;
  } while (lVar2 != 0x40);
  lVar2 = 0;
  do {
    (&__return_storage_ptr__->m_data[0].m_hasNaN)[lVar2] = false;
    *(undefined8 *)((long)&__return_storage_ptr__->m_data[0].m_lo + lVar2) = 0x7ff0000000000000;
    *(undefined8 *)((long)&__return_storage_ptr__->m_data[0].m_hi + lVar2) = 0xfff0000000000000;
    lVar2 = lVar2 + 0x18;
  } while (lVar2 == 0x18);
  lVar2 = 0;
  pIVar3 = __return_storage_ptr__->m_data;
  do {
    dVar1 = (double)value->m_data[lVar2];
    local_60.m_hasNaN = NAN(value->m_data[lVar2]);
    local_60.m_lo = INFINITY;
    if (!local_60.m_hasNaN) {
      local_60.m_lo = dVar1;
    }
    local_60.m_hi = -INFINITY;
    if (!local_60.m_hasNaN) {
      local_60.m_hi = dVar1;
    }
    tcu::FloatFormat::roundOut(&local_48,fmt,&local_60,false);
    pIVar3->m_hi = local_48.m_hi;
    pIVar3->m_hasNaN = local_48.m_hasNaN;
    *(undefined7 *)&pIVar3->field_0x1 = local_48._1_7_;
    pIVar3->m_lo = local_48.m_lo;
    lVar2 = lVar2 + 1;
    pIVar3 = pIVar3 + 1;
  } while (lVar2 == 1);
  return __return_storage_ptr__;
}

Assistant:

static IVal			doRound			(const FloatFormat& fmt, T value)
	{
		IVal ret;

		for (int ndx = 0; ndx < T::SIZE; ++ndx)
			ret[ndx] = round(fmt, value[ndx]);

		return ret;
	}